

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeForces.hpp
# Opt level: O0

void __thiscall
OpenMD::FluctuatingChargeForces::~FluctuatingChargeForces(FluctuatingChargeForces *this)

{
  vector<OpenMD::FluctuatingChargeAtomData,_std::allocator<OpenMD::FluctuatingChargeAtomData>_>
  *unaff_retaddr;
  
  std::vector<OpenMD::FluctuatingChargeAtomData,_std::allocator<OpenMD::FluctuatingChargeAtomData>_>
  ::~vector(unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x3fda41);
  FluctuatingChargeAtomData::~FluctuatingChargeAtomData((FluctuatingChargeAtomData *)0x3fda4f);
  std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::~set
            ((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
              *)0x3fda5d);
  return;
}

Assistant:

void setForceField(ForceField* ff) { forceField_ = ff; }